

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PhaseBotsGameCommand::trigger
          (PhaseBotsGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  PhaseBotsGameCommand *pPVar1;
  size_t sVar2;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  char *local_d8;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  PlayerInfo *player_local;
  Server *source_local;
  PhaseBotsGameCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (PhaseBotsGameCommand *)parameters._M_len;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = parameters_local._M_len;
  pPVar1 = this_local;
  if (bVar3) {
    bVar3 = togglePhasing(source);
    if (bVar3) {
      bVar5 = sv("Bot phasing has been enabled.",0x1d);
      local_40 = bVar5._M_len;
      local_38 = bVar5._M_str;
      RenX::Server::sendMessage(source,player,local_40,local_38);
    }
    else {
      bVar5 = sv("Bot phasing has been disabled.",0x1e);
      local_50 = bVar5._M_len;
      local_48 = bVar5._M_str;
      RenX::Server::sendMessage(source,player,local_50,local_48);
    }
  }
  else {
    bVar4 = sv("true",4);
    bVar5._M_str = (char *)sVar2;
    bVar5._M_len = (size_t)pPVar1;
    bVar3 = jessilib::equalsi<char,char>(bVar5,bVar4);
    sVar2 = parameters_local._M_len;
    pPVar1 = this_local;
    if (!bVar3) {
      bVar5 = sv("on",2);
      bVar4._M_str = (char *)sVar2;
      bVar4._M_len = (size_t)pPVar1;
      bVar3 = jessilib::equalsi<char,char>(bVar4,bVar5);
      sVar2 = parameters_local._M_len;
      pPVar1 = this_local;
      if (!bVar3) {
        bVar5 = sv("start",5);
        lhs_00._M_str = (char *)sVar2;
        lhs_00._M_len = (size_t)pPVar1;
        bVar3 = jessilib::equalsi<char,char>(lhs_00,bVar5);
        sVar2 = parameters_local._M_len;
        pPVar1 = this_local;
        if (!bVar3) {
          bVar5 = sv("1",1);
          lhs._M_str = (char *)sVar2;
          lhs._M_len = (size_t)pPVar1;
          bVar3 = jessilib::equalsi<char,char>(lhs,bVar5);
          if (!bVar3) {
            togglePhasing(source,false);
            bVar5 = sv("Bot phasing has been disabled.",0x1e);
            local_f0 = bVar5._M_len;
            local_e8 = bVar5._M_str;
            RenX::Server::sendMessage(source,player,local_f0,local_e8);
            return;
          }
        }
      }
    }
    togglePhasing(source,true);
    bVar5 = sv("Bot phasing has been enabled.",0x1d);
    local_e0 = bVar5._M_len;
    local_d8 = bVar5._M_str;
    RenX::Server::sendMessage(source,player,local_e0,local_d8);
  }
  return;
}

Assistant:

void PhaseBotsGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty())
	{
		if (togglePhasing(source))
			source->sendMessage(*player, "Bot phasing has been enabled."sv);
		else source->sendMessage(*player, "Bot phasing has been disabled."sv);
	}
	else if (jessilib::equalsi(parameters, "true"sv) || jessilib::equalsi(parameters, "on"sv)
		|| jessilib::equalsi(parameters, "start"sv) || jessilib::equalsi(parameters, "1"sv)) {
		togglePhasing(source, true);
		source->sendMessage(*player, "Bot phasing has been enabled."sv);
	}
	else
	{
		togglePhasing(source, false);
		source->sendMessage(*player, "Bot phasing has been disabled."sv);
	}
}